

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::exceptions::parsing::~parsing(parsing *this)

{
  exception::~exception(&this->super_exception);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit parsing(const std::string& message)
  : exception(message)
  {
  }